

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v8::detail::write<char,fmt::v8::appender>
                   (appender out,char value,basic_format_specs<char> *specs,locale_ref loc)

{
  basic_format_specs<char> *specs_00;
  locale_ref loc_00;
  locale_ref out_00;
  bool bVar1;
  write_int_arg<unsigned_int> arg;
  error_handler local_71;
  basic_format_specs<char> *local_70;
  basic_format_specs<char> *specs_local;
  locale_ref lStack_60;
  char value_local;
  locale_ref loc_local;
  appender out_local;
  
  local_70 = specs;
  specs_local._7_1_ = value;
  lStack_60.locale_ = loc.locale_;
  loc_local.locale_ =
       (void *)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  bVar1 = check_char_specs<char,fmt::v8::detail::error_handler>(specs,&local_71);
  out_00.locale_ = loc_local.locale_;
  loc_00 = lStack_60;
  specs_00 = local_70;
  if (bVar1) {
    out_local = write_char<char,fmt::v8::appender>
                          ((appender)loc_local.locale_,specs_local._7_1_,local_70);
  }
  else {
    arg = make_write_int_arg<int>
                    ((int)specs_local._7_1_,(uint)(*(ushort *)&local_70->field_0x9 >> 4 & 7));
    out_local = write_int_noinline<char,fmt::v8::appender,unsigned_int>
                          ((appender)out_00.locale_,arg,specs_00,loc_00);
  }
  return (appender)
         out_local.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, Char value,
                         const basic_format_specs<Char>& specs,
                         locale_ref loc = {}) -> OutputIt {
  return check_char_specs(specs)
             ? write_char(out, value, specs)
             : write(out, static_cast<int>(value), specs, loc);
}